

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

void __thiscall
google::protobuf::
Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>::InnerMap
::TransferTree(InnerMap *this,void **table,size_type index)

{
  bool bVar1;
  reference ppbVar2;
  size_type b;
  _Self *__x;
  _Self local_58;
  iterator local_50;
  Node *local_38;
  Node *node;
  iterator tree_it;
  Tree *tree;
  size_type index_local;
  void **table_local;
  InnerMap *this_local;
  
  tree_it._M_node = (_Base_ptr)table[index];
  node = (Node *)std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>::InnerMap::KeyCompare,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>::MapAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
                 ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>::InnerMap::KeyCompare,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>::MapAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
                          *)tree_it._M_node);
  do {
    ppbVar2 = std::
              _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
              ::operator*((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
                           *)&node);
    local_38 = NodePtrFromKeyPtr(*ppbVar2);
    ppbVar2 = std::
              _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
              ::operator*((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
                           *)&node);
    b = BucketNumber(this,*ppbVar2);
    InsertUnique(&local_50,this,b,local_38);
    __x = std::
          _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
          ::operator++((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
                        *)&node);
    local_58._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>::InnerMap::KeyCompare,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>::MapAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
         ::end(tree_it._M_node);
    bVar1 = std::operator!=(__x,&local_58);
  } while (bVar1);
  DestroyTree(this,(Tree *)tree_it._M_node);
  return;
}

Assistant:

void TransferTree(void* const* table, size_type index) {
      Tree* tree = static_cast<Tree*>(table[index]);
      typename Tree::iterator tree_it = tree->begin();
      do {
        Node* node = NodePtrFromKeyPtr(*tree_it);
        InsertUnique(BucketNumber(**tree_it), node);
      } while (++tree_it != tree->end());
      DestroyTree(tree);
    }